

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rng.c
# Opt level: O3

err_t rngESHealth(void)

{
  bool bVar1;
  err_t eVar2;
  long lVar3;
  bool bVar4;
  
  lVar3 = 0;
  bVar1 = true;
  do {
    bVar4 = bVar1;
    eVar2 = rngESTest((&PTR_anon_var_dwarf_3ee2_00174d70)[lVar3]);
    if (eVar2 == 0) {
      return 0;
    }
    lVar3 = 1;
    bVar1 = false;
  } while (bVar4);
  lVar3 = 0;
  bVar1 = false;
  while ((eVar2 = rngESTest((char *)((long)&DAT_0015cb98 +
                                    (long)*(int *)((long)&DAT_0015cb98 + lVar3))), eVar2 != 0 ||
         (bVar4 = !bVar1, bVar1 = true, bVar4))) {
    lVar3 = lVar3 + 4;
    if (lVar3 == 0xc) {
      return bVar1 | 0x12e;
    }
  }
  return 0;
}

Assistant:

err_t rngESHealth()
{
	const char* sources[] = { "sys", "sys2", "timer" };
	size_t valid_sources = 0;
	size_t pos;
	// есть работоспособный физический источник?
	if (rngESHealth2() == ERR_OK)
		return ERR_OK;
	// проверить остальные источники
	for (pos = 0; pos < COUNT_OF(sources); ++pos)
	{
		if (rngESTest(sources[pos]) != ERR_OK)
			continue;
		// два работоспособных источника?
		if (++valid_sources == 2)
			return ERR_OK;
	}
	// только один?
	if (valid_sources == 1)
		return ERR_NOT_ENOUGH_ENTROPY;
	// ни одного
	return ERR_BAD_ENTROPY;
}